

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O0

void __thiscall icu_63::UVector64::_init(UVector64 *this,int32_t initialCapacity,UErrorCode *status)

{
  int64_t *piVar1;
  UErrorCode *status_local;
  int32_t initialCapacity_local;
  UVector64 *this_local;
  
  status_local._4_4_ = initialCapacity;
  if (initialCapacity < 1) {
    status_local._4_4_ = 8;
  }
  if ((0 < this->maxCapacity) && (this->maxCapacity < status_local._4_4_)) {
    status_local._4_4_ = this->maxCapacity;
  }
  if (0xfffffff < status_local._4_4_) {
    status_local._4_4_ = uprv_min_63(8,this->maxCapacity);
  }
  piVar1 = (int64_t *)uprv_malloc_63((long)status_local._4_4_ << 3);
  this->elements = piVar1;
  if (this->elements == (int64_t *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    this->capacity = status_local._4_4_;
  }
  return;
}

Assistant:

void UVector64::_init(int32_t initialCapacity, UErrorCode &status) {
    // Fix bogus initialCapacity values; avoid malloc(0)
    if (initialCapacity < 1) {
        initialCapacity = DEFAULT_CAPACITY;
    }
    if (maxCapacity>0 && maxCapacity<initialCapacity) {
        initialCapacity = maxCapacity;
    }
    if (initialCapacity > (int32_t)(INT32_MAX / sizeof(int64_t))) {
        initialCapacity = uprv_min(DEFAULT_CAPACITY, maxCapacity);
    }
    elements = (int64_t *)uprv_malloc(sizeof(int64_t)*initialCapacity);
    if (elements == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        capacity = initialCapacity;
    }
}